

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O0

void find_eob(tran_low_t *qcoeff_ptr,int16_t *iscan,__m128i *eob)

{
  undefined8 uVar1;
  undefined8 uVar2;
  longlong lVar3;
  longlong lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  ulong local_178;
  ulong uStack_170;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  __m128i nz_flag1;
  __m128i nz_flag0;
  __m128i q1;
  __m128i q0;
  __m128i iscanIdx;
  __m128i mask;
  __m128i zero;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  __m128i *eob_local;
  
  nz_flag1[1]._0_4_ = (int)*(undefined8 *)qcoeff_ptr;
  nz_flag1[1]._4_4_ = (int)((ulong)*(undefined8 *)qcoeff_ptr >> 0x20);
  nz_flag0[0]._0_4_ = (int)*(undefined8 *)(qcoeff_ptr + 2);
  nz_flag0[0]._4_4_ = (int)((ulong)*(undefined8 *)(qcoeff_ptr + 2) >> 0x20);
  local_98 = (int)*(undefined8 *)(qcoeff_ptr + 4);
  iStack_94 = (int)((ulong)*(undefined8 *)(qcoeff_ptr + 4) >> 0x20);
  iStack_90 = (int)*(undefined8 *)(qcoeff_ptr + 6);
  iStack_8c = (int)((ulong)*(undefined8 *)(qcoeff_ptr + 6) >> 0x20);
  auVar5._4_4_ = -(uint)(nz_flag1[1]._4_4_ != 0);
  auVar5._0_4_ = -(uint)((int)nz_flag1[1] != 0);
  auVar5._12_4_ = -(uint)(nz_flag0[0]._4_4_ != 0);
  auVar5._8_4_ = -(uint)((int)nz_flag0[0] != 0);
  auVar6._4_4_ = -(uint)(iStack_94 != 0);
  auVar6._0_4_ = -(uint)(local_98 != 0);
  auVar6._12_4_ = -(uint)(iStack_8c != 0);
  auVar6._8_4_ = -(uint)(iStack_90 != 0);
  auVar6 = packssdw(auVar5,auVar6);
  uVar1 = *(undefined8 *)iscan;
  uVar2 = *(undefined8 *)(iscan + 4);
  local_178 = auVar6._0_8_;
  uStack_170 = auVar6._8_8_;
  iscanIdx[1]._0_2_ = (short)uVar1;
  iscanIdx[1]._2_2_ = (short)((ulong)uVar1 >> 0x10);
  iscanIdx[1]._4_2_ = (short)((ulong)uVar1 >> 0x20);
  iscanIdx[1]._6_2_ = (short)((ulong)uVar1 >> 0x30);
  mask[0]._0_2_ = (short)uVar2;
  mask[0]._2_2_ = (short)((ulong)uVar2 >> 0x10);
  mask[0]._4_2_ = (short)((ulong)uVar2 >> 0x20);
  mask[0]._6_2_ = (short)((ulong)uVar2 >> 0x30);
  q0[1]._0_2_ = auVar6._0_2_;
  q0[1]._2_2_ = auVar6._2_2_;
  q0[1]._4_2_ = auVar6._4_2_;
  q0[1]._6_2_ = auVar6._6_2_;
  iscanIdx[0]._0_2_ = auVar6._8_2_;
  iscanIdx[0]._2_2_ = auVar6._10_2_;
  iscanIdx[0]._4_2_ = auVar6._12_2_;
  iscanIdx[0]._6_2_ = auVar6._14_2_;
  local_188 = CONCAT26(iscanIdx[1]._6_2_ - q0[1]._6_2_,
                       CONCAT24(iscanIdx[1]._4_2_ - q0[1]._4_2_,
                                CONCAT22(iscanIdx[1]._2_2_ - q0[1]._2_2_,
                                         (short)iscanIdx[1] - (short)q0[1])));
  uStack_180 = CONCAT26(mask[0]._6_2_ - iscanIdx[0]._6_2_,
                        CONCAT24(mask[0]._4_2_ - iscanIdx[0]._4_2_,
                                 CONCAT22(mask[0]._2_2_ - iscanIdx[0]._2_2_,
                                          (short)mask[0] - (short)iscanIdx[0])));
  local_188 = local_188 & local_178;
  uStack_180 = uStack_180 & uStack_170;
  lVar3 = (*eob)[0];
  lVar4 = (*eob)[1];
  zero[1]._0_2_ = (short)lVar3;
  zero[1]._2_2_ = (short)((ulong)lVar3 >> 0x10);
  zero[1]._4_2_ = (short)((ulong)lVar3 >> 0x20);
  zero[1]._6_2_ = (short)((ulong)lVar3 >> 0x30);
  sStack_10 = (short)lVar4;
  sStack_e = (short)((ulong)lVar4 >> 0x10);
  sStack_c = (short)((ulong)lVar4 >> 0x20);
  sStack_a = (short)((ulong)lVar4 >> 0x30);
  mask[1]._0_2_ = (short)local_188;
  mask[1]._2_2_ = (short)(local_188 >> 0x10);
  mask[1]._4_2_ = (short)(local_188 >> 0x20);
  mask[1]._6_2_ = (short)(local_188 >> 0x30);
  zero[0]._0_2_ = (short)uStack_180;
  zero[0]._2_2_ = (short)(uStack_180 >> 0x10);
  zero[0]._4_2_ = (short)(uStack_180 >> 0x20);
  zero[0]._6_2_ = (short)(uStack_180 >> 0x30);
  *(ushort *)*eob =
       (ushort)((short)zero[1] < (short)mask[1]) * (short)mask[1] |
       (ushort)((short)zero[1] >= (short)mask[1]) * (short)zero[1];
  *(ushort *)((long)*eob + 2) =
       (ushort)(zero[1]._2_2_ < mask[1]._2_2_) * mask[1]._2_2_ |
       (ushort)(zero[1]._2_2_ >= mask[1]._2_2_) * zero[1]._2_2_;
  *(ushort *)((long)*eob + 4) =
       (ushort)(zero[1]._4_2_ < mask[1]._4_2_) * mask[1]._4_2_ |
       (ushort)(zero[1]._4_2_ >= mask[1]._4_2_) * zero[1]._4_2_;
  *(ushort *)((long)*eob + 6) =
       (ushort)(zero[1]._6_2_ < mask[1]._6_2_) * mask[1]._6_2_ |
       (ushort)(zero[1]._6_2_ >= mask[1]._6_2_) * zero[1]._6_2_;
  *(ushort *)(*eob + 1) =
       (ushort)(sStack_10 < (short)zero[0]) * (short)zero[0] |
       (ushort)(sStack_10 >= (short)zero[0]) * sStack_10;
  *(ushort *)((long)*eob + 10) =
       (ushort)(sStack_e < zero[0]._2_2_) * zero[0]._2_2_ |
       (ushort)(sStack_e >= zero[0]._2_2_) * sStack_e;
  *(ushort *)((long)*eob + 0xc) =
       (ushort)(sStack_c < zero[0]._4_2_) * zero[0]._4_2_ |
       (ushort)(sStack_c >= zero[0]._4_2_) * sStack_c;
  *(ushort *)((long)*eob + 0xe) =
       (ushort)(sStack_a < zero[0]._6_2_) * zero[0]._6_2_ |
       (ushort)(sStack_a >= zero[0]._6_2_) * sStack_a;
  return;
}

Assistant:

static inline void find_eob(tran_low_t *qcoeff_ptr, const int16_t *iscan,
                            __m128i *eob) {
  const __m128i zero = _mm_setzero_si128();
  __m128i mask, iscanIdx;
  const __m128i q0 = _mm_loadu_si128((__m128i const *)qcoeff_ptr);
  const __m128i q1 = _mm_loadu_si128((__m128i const *)(qcoeff_ptr + 4));
  __m128i nz_flag0 = _mm_cmpeq_epi32(q0, zero);
  __m128i nz_flag1 = _mm_cmpeq_epi32(q1, zero);

  nz_flag0 = _mm_cmpeq_epi32(nz_flag0, zero);
  nz_flag1 = _mm_cmpeq_epi32(nz_flag1, zero);

  mask = _mm_packs_epi32(nz_flag0, nz_flag1);
  iscanIdx = _mm_loadu_si128((__m128i const *)iscan);
  iscanIdx = _mm_sub_epi16(iscanIdx, mask);
  iscanIdx = _mm_and_si128(iscanIdx, mask);
  *eob = _mm_max_epi16(*eob, iscanIdx);
}